

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

void __thiscall Parser::setTokenNames(Parser *this,char **tokenNames_)

{
  char **ppcVar1;
  char *pcVar2;
  allocator local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pcVar2 = *tokenNames_;
  if (pcVar2 != (char *)0x0) {
    ppcVar1 = tokenNames_ + 1;
    do {
      std::__cxx11::string::string((string *)&local_48,pcVar2,&local_49);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->tokenNames,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      pcVar2 = *ppcVar1;
      ppcVar1 = ppcVar1 + 1;
    } while (pcVar2 != (char *)0x0);
  }
  return;
}

Assistant:

void Parser::setTokenNames(const char** tokenNames_)
{
	while (*tokenNames_) {
		tokenNames.push_back(*(tokenNames_++));
	}
}